

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

ostream * __thiscall CDT::print(CDT *this,ostream *out)

{
  pointer pLVar1;
  bool bVar2;
  pointer pbVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  Layer *layer;
  ulong uVar7;
  pointer pLVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  char local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"\tCDT-Model structure.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(out," | Data set status: ",0x14);
  bVar2 = DataSet::empty(&this->m_dataset);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"None.\n",6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Ready.\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(out," | Feautures: ",0xe);
    DataSet::labels_abi_cxx11_(&local_48,&this->m_dataset);
    pbVar3 = (pointer)CONCAT71(local_48.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_48.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
      uVar6 = 1;
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar3[uVar7]._M_dataplus._M_p,pbVar3[uVar7]._M_string_length);
        pbVar3 = (pointer)CONCAT71(local_48.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_48.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
        uVar5 = (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
        if (uVar7 < uVar5 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
          pbVar3 = (pointer)CONCAT71(local_48.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_48.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_);
          uVar5 = (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
        }
        uVar7 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar7 < uVar5);
    }
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(out,&local_49,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," | # of layers: ",0x10);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out," \t",2);
  pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar8 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar8 != pLVar1; pLVar8 = pLVar8 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"|- ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -|",3);
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_48,1);
  std::__ostream_insert<char,std::char_traits<char>>(out," | Weight structure:",0x14);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_48,1);
  return out;
}

Assistant:

std::ostream& CDT::print(std::ostream& out) const{
    out<<"\tCDT-Model structure.\n";
    
    out<<" | Data set status: ";
    if(!m_dataset.empty()){
        out<<"Ready.\n";

        out<<" | Feautures: ";
        std::vector<std::string> labels=m_dataset.labels();
        for(unsigned i=0;i<labels.size();++i){
            out<<labels[i];
            if(i<labels.size()-1) out<<", ";
        }
        out<<'\n';
    } else  out<<"None.\n";

    out<<" | # of layers: "<<m_layers.size()<<"\n";
    out<<" \t";
    for(const auto& layer: m_layers)
        out<<"|- "<<layer.m_shape.n_col<<" -|";
    out<<'\n';

    out<<" | Weight structure:";
    out<<'\n';

    return out;
}